

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx2::LineSegmentsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  unsigned_long uVar12;
  bool bVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar11 = r->_begin;
  uVar12 = r->_end;
  if (uVar11 < uVar12) {
    auVar15._8_4_ = 0xff800000;
    auVar15._0_8_ = 0xff800000ff800000;
    auVar15._12_4_ = 0xff800000;
    auVar16 = ZEXT1664(auVar15);
    auVar17._8_4_ = 0x7f800000;
    auVar17._0_8_ = 0x7f8000007f800000;
    auVar17._12_4_ = 0x7f800000;
    auVar18 = ZEXT1664(auVar17);
    sVar9 = 0;
    auVar25._8_4_ = 0xddccb9a2;
    auVar25._0_8_ = 0xddccb9a2ddccb9a2;
    auVar25._12_4_ = 0xddccb9a2;
    auVar26._8_4_ = 0x5dccb9a2;
    auVar26._0_8_ = 0x5dccb9a25dccb9a2;
    auVar26._12_4_ = 0x5dccb9a2;
    auVar21 = ZEXT1664(auVar17);
    auVar24 = ZEXT1664(auVar15);
    do {
      pBVar2 = (this->super_LineSegments).vertices.items;
      uVar1 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                       *(long *)&(this->super_LineSegments).field_0x68 * uVar11);
      uVar8 = (ulong)(uVar1 + 1);
      if (uVar8 < (pBVar2->super_RawBufferView).num) {
        bVar13 = false;
        lVar14 = 0;
        do {
          if (bVar13) {
            pcVar3 = (this->super_LineSegments).vertices0.super_RawBufferView.ptr_ofs;
            sVar4 = (this->super_LineSegments).vertices0.super_RawBufferView.stride;
            lVar10 = uVar1 * sVar4;
            lVar14 = uVar8 * sVar4;
            auVar27 = vminps_avx(*(undefined1 (*) [16])(pcVar3 + lVar10),
                                 *(undefined1 (*) [16])(pcVar3 + lVar14));
            auVar15 = vmaxps_avx(*(undefined1 (*) [16])(pcVar3 + lVar10),
                                 *(undefined1 (*) [16])(pcVar3 + lVar14));
            auVar17 = vmaxss_avx(ZEXT416(*(uint *)(pcVar3 + lVar14 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar3 + lVar10 + 0xc)));
            fVar7 = auVar17._0_4_ * (this->super_LineSegments).maxRadiusScale;
            auVar28._4_4_ = fVar7;
            auVar28._0_4_ = fVar7;
            auVar28._8_4_ = fVar7;
            auVar28._12_4_ = fVar7;
            auVar17 = vsubps_avx(auVar27,auVar28);
            aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar17,ZEXT416(geomID),0x30);
            auVar27._0_4_ = auVar15._0_4_ + fVar7;
            auVar27._4_4_ = auVar15._4_4_ + fVar7;
            auVar27._8_4_ = auVar15._8_4_ + fVar7;
            auVar27._12_4_ = auVar15._12_4_ + fVar7;
            aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar27,ZEXT416((uint)uVar11),0x30);
            auVar15 = vminps_avx(auVar18._0_16_,(undefined1  [16])aVar5);
            auVar18 = ZEXT1664(auVar15);
            auVar15 = vmaxps_avx(auVar16._0_16_,(undefined1  [16])aVar6);
            auVar16 = ZEXT1664(auVar15);
            auVar29._0_4_ = aVar5.x + aVar6.x;
            auVar29._4_4_ = aVar5.y + aVar6.y;
            auVar29._8_4_ = aVar5.z + aVar6.z;
            auVar29._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
            auVar15 = vminps_avx(auVar21._0_16_,auVar29);
            auVar21 = ZEXT1664(auVar15);
            auVar15 = vmaxps_avx(auVar24._0_16_,auVar29);
            auVar24 = ZEXT1664(auVar15);
            sVar9 = sVar9 + 1;
            prims[k].upper.field_0.field_1 = aVar6;
            prims[k].lower.field_0.field_1 = aVar5;
            uVar12 = r->_end;
            k = k + 1;
            break;
          }
          pcVar3 = pBVar2[lVar14].super_RawBufferView.ptr_ofs;
          sVar4 = pBVar2[lVar14].super_RawBufferView.stride;
          auVar15 = *(undefined1 (*) [16])(pcVar3 + sVar4 * uVar1);
          auVar17 = vcmpps_avx(auVar15,auVar25,2);
          auVar27 = vcmpps_avx(auVar15,auVar26,5);
          auVar17 = vorps_avx(auVar17,auVar27);
          if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar17[0xf] < '\0') break;
          auVar17 = *(undefined1 (*) [16])(pcVar3 + sVar4 * uVar8);
          auVar27 = vcmpps_avx(auVar17,auVar25,2);
          auVar28 = vcmpps_avx(auVar17,auVar26,5);
          auVar27 = vorps_avx(auVar27,auVar28);
          if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar27[0xf] < '\0') break;
          auVar15 = vshufps_avx(auVar15,auVar15,0xff);
          auVar17 = vshufps_avx(auVar17,auVar17,0xff);
          auVar15 = vminss_avx(auVar15,auVar17);
          lVar14 = 1;
          bVar13 = true;
        } while (0.0 <= auVar15._0_4_);
      }
      aVar22 = auVar24._0_16_;
      aVar19 = auVar21._0_16_;
      aVar23 = auVar16._0_16_;
      aVar20 = auVar18._0_16_;
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar12);
  }
  else {
    aVar20.m128[2] = INFINITY;
    aVar20._0_8_ = 0x7f8000007f800000;
    aVar20.m128[3] = INFINITY;
    aVar23.m128[2] = -INFINITY;
    aVar23._0_8_ = 0xff800000ff800000;
    aVar23.m128[3] = -INFINITY;
    sVar9 = 0;
    aVar19 = aVar20;
    aVar22 = aVar23;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar23;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar19;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar22;
  __return_storage_ptr__->end = sVar9;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }